

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O0

void duckdb::TernaryExecutor::
     ExecuteGeneric<duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::TernaryLambdaWrapper,duckdb::string_t(*)(duckdb::string_t,duckdb::string_t,duckdb::string_t)>
               (Vector *a,Vector *b,Vector *c,Vector *result,idx_t count,
               _func_string_t_string_t_string_t_string_t *fun)

{
  string_t a_00;
  string_t c_00;
  VectorType VVar1;
  bool bVar2;
  Vector *in_RCX;
  Vector *in_RDX;
  Vector *in_RSI;
  Vector *in_RDI;
  UnifiedVectorFormat *in_R8;
  string_t sVar3;
  UnifiedVectorFormat cdata_1;
  UnifiedVectorFormat bdata_1;
  UnifiedVectorFormat adata_1;
  ValidityMask *result_validity;
  string_t *result_data;
  string_t *cdata;
  string_t *bdata;
  string_t *adata;
  UnifiedVectorFormat *this;
  ValidityMask *in_stack_fffffffffffffde8;
  _func_string_t_string_t_string_t_string_t *in_stack_fffffffffffffdf0;
  undefined8 in_stack_fffffffffffffdf8;
  undefined8 in_stack_fffffffffffffe00;
  undefined8 in_stack_fffffffffffffe08;
  undefined8 in_stack_fffffffffffffe10;
  undefined8 in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffe38;
  idx_t in_stack_fffffffffffffe40;
  UnifiedVectorFormat *local_1a8 [6];
  SelectionVector *in_stack_fffffffffffffe88;
  idx_t in_stack_fffffffffffffe90;
  string_t *in_stack_fffffffffffffe98;
  string_t *in_stack_fffffffffffffea0;
  string_t *in_stack_fffffffffffffea8;
  string_t *in_stack_fffffffffffffeb0;
  SelectionVector *in_stack_fffffffffffffec0;
  SelectionVector *in_stack_fffffffffffffec8;
  ValidityMask *in_stack_fffffffffffffed0;
  ValidityMask *in_stack_fffffffffffffed8;
  ValidityMask *in_stack_fffffffffffffee0;
  ValidityMask *in_stack_fffffffffffffee8;
  _func_string_t_string_t_string_t_string_t *in_stack_fffffffffffffef0;
  UnifiedVectorFormat local_108 [72];
  undefined8 local_c0;
  char *local_b8;
  undefined8 local_b0;
  char *local_a8;
  undefined8 local_a0;
  char *local_98;
  undefined8 local_90;
  char *local_88;
  ValidityMask *local_80;
  string_t *local_78;
  string_t *local_70;
  string_t *local_68;
  string_t *local_60;
  UnifiedVectorFormat *local_50;
  Vector *local_48;
  Vector *local_40;
  Vector *local_38;
  Vector *local_30;
  
  local_50 = in_R8;
  local_48 = in_RCX;
  local_40 = in_RDX;
  local_38 = in_RSI;
  local_30 = in_RDI;
  VVar1 = Vector::GetVectorType(in_RDI);
  if (((VVar1 == CONSTANT_VECTOR) &&
      (VVar1 = Vector::GetVectorType(local_38), VVar1 == CONSTANT_VECTOR)) &&
     (VVar1 = Vector::GetVectorType(local_40), VVar1 == CONSTANT_VECTOR)) {
    duckdb::Vector::SetVectorType((VectorType)local_48);
    bVar2 = ConstantVector::IsNull((Vector *)0x4eb6ae);
    if (((bVar2) || (bVar2 = ConstantVector::IsNull((Vector *)0x4eb6bf), bVar2)) ||
       (bVar2 = ConstantVector::IsNull((Vector *)0x4eb6d0), bVar2)) {
      duckdb::ConstantVector::SetNull(local_48,true);
    }
    else {
      local_60 = ConstantVector::GetData<duckdb::string_t>((Vector *)0x4eb6fa);
      local_68 = ConstantVector::GetData<duckdb::string_t>((Vector *)0x4eb70f);
      local_70 = ConstantVector::GetData<duckdb::string_t>((Vector *)0x4eb724);
      local_78 = ConstantVector::GetData<duckdb::string_t>((Vector *)0x4eb739);
      local_80 = ConstantVector::Validity(local_48);
      local_a0 = *(undefined8 *)&local_60->value;
      local_98 = (local_60->value).pointer.ptr;
      local_b0 = *(undefined8 *)&local_68->value;
      local_a8 = (local_68->value).pointer.ptr;
      local_c0 = *(undefined8 *)&local_70->value;
      local_b8 = (local_70->value).pointer.ptr;
      a_00.value.pointer.ptr = (char *)in_stack_fffffffffffffe10;
      a_00.value._0_8_ = in_stack_fffffffffffffe08;
      sVar3.value.pointer.ptr = (char *)in_stack_fffffffffffffe00;
      sVar3.value._0_8_ = in_stack_fffffffffffffdf8;
      c_00.value.pointer.ptr = (char *)in_stack_fffffffffffffe38;
      c_00.value._0_8_ = in_stack_fffffffffffffe30;
      sVar3 = TernaryLambdaWrapper::
              Operation<duckdb::string_t(*)(duckdb::string_t,duckdb::string_t,duckdb::string_t),duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                        (in_stack_fffffffffffffdf0,a_00,sVar3,c_00,in_stack_fffffffffffffde8,
                         in_stack_fffffffffffffe40);
      local_90 = sVar3.value._0_8_;
      *(undefined8 *)&local_78->value = local_90;
      local_88 = sVar3.value._8_8_;
      (local_78->value).pointer.ptr = local_88;
    }
  }
  else {
    duckdb::Vector::SetVectorType((VectorType)local_48);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat(local_108);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat
              ((UnifiedVectorFormat *)&stack0xfffffffffffffeb0);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_1a8);
    duckdb::Vector::ToUnifiedFormat((ulong)local_30,local_50);
    duckdb::Vector::ToUnifiedFormat((ulong)local_38,local_50);
    duckdb::Vector::ToUnifiedFormat((ulong)local_40,local_50);
    UnifiedVectorFormat::GetData<duckdb::string_t>(local_108);
    UnifiedVectorFormat::GetData<duckdb::string_t>((UnifiedVectorFormat *)&stack0xfffffffffffffeb0);
    UnifiedVectorFormat::GetData<duckdb::string_t>((UnifiedVectorFormat *)local_1a8);
    FlatVector::GetData<duckdb::string_t>((Vector *)0x4eb91a);
    this = local_1a8[0];
    FlatVector::Validity((Vector *)0x4eb990);
    ExecuteLoop<duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::TernaryLambdaWrapper,duckdb::string_t(*)(duckdb::string_t,duckdb::string_t,duckdb::string_t)>
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
               in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
               in_stack_fffffffffffffec0,in_stack_fffffffffffffec8,in_stack_fffffffffffffed0,
               in_stack_fffffffffffffed8,in_stack_fffffffffffffee0,in_stack_fffffffffffffee8,
               in_stack_fffffffffffffef0);
    UnifiedVectorFormat::~UnifiedVectorFormat(this);
    UnifiedVectorFormat::~UnifiedVectorFormat(this);
    UnifiedVectorFormat::~UnifiedVectorFormat(this);
  }
  return;
}

Assistant:

static void ExecuteGeneric(Vector &a, Vector &b, Vector &c, Vector &result, idx_t count, FUN fun) {
		if (a.GetVectorType() == VectorType::CONSTANT_VECTOR && b.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    c.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			if (ConstantVector::IsNull(a) || ConstantVector::IsNull(b) || ConstantVector::IsNull(c)) {
				ConstantVector::SetNull(result, true);
			} else {
				auto adata = ConstantVector::GetData<A_TYPE>(a);
				auto bdata = ConstantVector::GetData<B_TYPE>(b);
				auto cdata = ConstantVector::GetData<C_TYPE>(c);
				auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);
				auto &result_validity = ConstantVector::Validity(result);
				result_data[0] = OPWRAPPER::template Operation<FUN, A_TYPE, B_TYPE, C_TYPE, RESULT_TYPE>(
				    fun, adata[0], bdata[0], cdata[0], result_validity, 0);
			}
		} else {
			result.SetVectorType(VectorType::FLAT_VECTOR);

			UnifiedVectorFormat adata, bdata, cdata;
			a.ToUnifiedFormat(count, adata);
			b.ToUnifiedFormat(count, bdata);
			c.ToUnifiedFormat(count, cdata);

			ExecuteLoop<A_TYPE, B_TYPE, C_TYPE, RESULT_TYPE, OPWRAPPER>(
			    UnifiedVectorFormat::GetData<A_TYPE>(adata), UnifiedVectorFormat::GetData<B_TYPE>(bdata),
			    UnifiedVectorFormat::GetData<C_TYPE>(cdata), FlatVector::GetData<RESULT_TYPE>(result), count,
			    *adata.sel, *bdata.sel, *cdata.sel, adata.validity, bdata.validity, cdata.validity,
			    FlatVector::Validity(result), fun);
		}
	}